

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O1

JL_STATUS JlParseJsonEx(char *JsonString,_Bool IsJson5,JlDataObject **pRootObject,
                       size_t *pErrorAtPos)

{
  ParseStack *pPVar1;
  char *pcVar2;
  JlDataObject **pNewObject;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  ParseStack *pPVar7;
  undefined8 uVar8;
  bool bVar9;
  JL_STATUS JVar10;
  int iVar11;
  JL_STATUS JVar12;
  ulong uVar13;
  size_t JsonStringLength;
  ulong uVar14;
  _Bool _Var15;
  size_t sVar16;
  bool bVar17;
  int *String;
  ulong __n;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  char cVar22;
  char *pcVar23;
  char **ppcVar24;
  ulong uVar25;
  char *pcVar26;
  bool bVar27;
  bool bVar28;
  size_t newStringIndex;
  ParseParameters params;
  JL_DATA_TYPE newType;
  JL_DATA_TYPE newType_1;
  char *local_b0;
  ParseParameters local_a8;
  char *local_70;
  size_t local_68;
  uint local_5c;
  size_t *local_58;
  ulong local_50;
  char *local_48;
  JlDataObject **local_40;
  JL_DATA_TYPE local_34;
  
  JVar10 = JL_STATUS_INVALID_PARAMETER;
  if (pRootObject != (JlDataObject **)0x0 && JsonString != (char *)0x0) {
    local_a8.JsonStringLength = 0;
    local_a8.StringIndex = 0;
    local_a8.IsJson5 = false;
    local_a8._41_7_ = 0;
    local_a8.Stack = (ParseStack *)0x0;
    local_a8._8_8_ = 0;
    local_a8.JsonString = JsonString;
    local_a8.JsonStringLength = strlen(JsonString);
    local_a8.StringIndex = 0;
    local_a8.IsJson5 = IsJson5;
    local_a8.Stack = (ParseStack *)WjTestLib_Calloc(0xa50,1);
    if (pErrorAtPos != (size_t *)0x0) {
      *pErrorAtPos = 0;
    }
    if (local_a8.Stack == (ParseStack *)0x0) {
      JVar10 = JL_STATUS_OUT_OF_MEMORY;
      pcVar26 = (char *)0x0;
    }
    else {
      local_a8._8_8_ = local_a8._8_8_ & 0xffffffff00000000;
      (local_a8.Stack)->Type = JL_DATA_TYPE_NONE;
      (local_a8.Stack)->ScanForSubObjects = true;
      local_5c = (uint)IsJson5;
      uVar25 = 0;
      pcVar23 = (char *)0x0;
      local_58 = pErrorAtPos;
      local_48 = JsonString;
      local_40 = pRootObject;
      do {
        uVar8 = local_a8._40_8_;
        pcVar26 = (char *)local_a8.StringIndex;
        sVar16 = local_a8.JsonStringLength;
        pcVar2 = local_a8.JsonString;
        pPVar7 = local_a8.Stack;
        iVar11 = (int)uVar25;
        pPVar1 = local_a8.Stack + uVar25;
        if (pPVar1->FinishedProcessing != false) {
          JVar10 = JL_STATUS_SUCCESS;
          if (0 < iVar11) {
            if (pPVar1[-1].Type == JL_DATA_TYPE_DICTIONARY) {
              JVar10 = JlAttachObjectToDictionaryObject
                                 (pPVar1[-1].Object,pPVar1[-1].CurrentKeyName,pPVar1->Object);
              if ((pErrorAtPos != (size_t *)0x0) && (JVar10 != JL_STATUS_SUCCESS)) {
                *pErrorAtPos = pPVar1[-1].CurrentKeyStringIndex;
              }
              WjTestLib_Free(pPVar1[-1].CurrentKeyName);
              pPVar1[-1].CurrentKeyName = (char *)0x0;
            }
            else if (pPVar1[-1].Type == JL_DATA_TYPE_LIST) {
              JVar10 = JlAttachObjectToListObject(pPVar1[-1].Object,pPVar1->Object);
            }
          }
          local_a8.StackIndex = local_a8.StackIndex + -1;
          pcVar26 = pcVar23;
          goto LAB_001034ec;
        }
        if (pPVar1->ScanForSubObjects == true) {
          if (pPVar1->Type == JL_DATA_TYPE_NONE) {
            pPVar1->FinishedProcessing = true;
            pPVar1->ScanForSubObjects = false;
          }
          pPVar1->ScanForSubObjects = false;
          local_68 = local_68 & 0xffffffff00000000;
          JVar10 = DetectNewType(local_a8.JsonString,local_a8.JsonStringLength,local_a8.StringIndex,
                                 SUB41(local_5c,0),(size_t *)&local_b0,(JL_DATA_TYPE *)&local_68,
                                 pErrorAtPos);
          if (((JL_DATA_TYPE)local_68 != JL_DATA_TYPE_NONE && JVar10 == JL_STATUS_SUCCESS) &&
             (JVar10 = JL_STATUS_JSON_NESTING_TOO_DEEP, iVar11 < 0x41)) {
            local_a8.StringIndex = (size_t)local_b0;
            local_a8.StackIndex = iVar11 + 1U;
            pNewObject = &pPVar7[iVar11 + 1U].Object;
            *(undefined8 *)(pNewObject + -1) = 0;
            *pNewObject = (JlDataObject *)0x0;
            pNewObject[1] = (JlDataObject *)0x0;
            pNewObject[2] = (JlDataObject *)0x0;
            pNewObject[3] = (JlDataObject *)0x0;
            ((ParseStack *)(pNewObject + -1))->Type = (JL_DATA_TYPE)local_68;
            JVar10 = JlCreateObjectWithTag((JL_DATA_TYPE)local_68,(size_t)local_b0,pNewObject);
          }
          goto LAB_001034ec;
        }
        _Var15 = local_a8.IsJson5;
        switch(pPVar1->Type) {
        case JL_DATA_TYPE_STRING:
          local_b0 = (char *)0x0;
          String = (int *)(local_a8.JsonString + local_a8.StringIndex);
          sVar16 = local_a8.JsonStringLength - local_a8.StringIndex;
          local_68 = 0;
          JVar10 = JL_STATUS_NOT_FOUND;
          bVar27 = true;
          if ((3 < sVar16) && (*String == 0x6c6c756e)) {
            local_a8.Stack[uVar25].FinishedProcessing = true;
            local_a8.StringIndex = local_a8.StringIndex + 4;
            bVar27 = false;
            JVar10 = JL_STATUS_SUCCESS;
          }
          if (bVar27) {
            JVar10 = ParseString((char *)String,sVar16,false,local_a8.IsJson5,&local_68,&local_b0);
            pcVar23 = local_b0;
            if (JVar10 == JL_STATUS_SUCCESS) {
              local_a8.StringIndex = local_a8.StringIndex + local_68;
              local_a8.Stack[local_a8.StackIndex].FinishedProcessing = true;
              JVar10 = JlSetObjectString(local_a8.Stack[local_a8.StackIndex].Object,local_b0);
              goto LAB_00103bfc;
            }
            if (local_68 != 0 && pErrorAtPos != (size_t *)0x0) {
              *pErrorAtPos = (size_t)(local_a8.StringIndex + local_68);
            }
          }
          goto LAB_00103c07;
        case JL_DATA_TYPE_NUMBER:
          pcVar23 = local_a8.JsonString + local_a8.StringIndex;
          uVar25 = local_a8.JsonStringLength - local_a8.StringIndex;
          JVar12 = JL_STATUS_SUCCESS;
          local_70 = pcVar23;
          if (local_a8.IsJson5 == true) {
            if (uVar25 < 4) {
              if ((uVar25 != 3) ||
                 ((iVar11 = strncasecmp(pcVar23,"inf",3), iVar11 != 0 &&
                  (iVar11 = strncasecmp(pcVar23,"nan",3), iVar11 != 0)))) goto LAB_00103756;
              bVar27 = true;
              __n = 3;
            }
            else {
              iVar11 = strncasecmp(pcVar23,"+inf",4);
              if ((iVar11 != 0) && (iVar11 = strncasecmp(pcVar23,"-inf",4), iVar11 != 0))
              goto LAB_00103756;
              bVar27 = true;
              __n = 4;
            }
          }
          else {
LAB_00103756:
            __n = 0;
            bVar27 = false;
          }
          pErrorAtPos = local_58;
          if ((char *)sVar16 == pcVar26 || bVar27) {
            bVar28 = false;
            uVar13 = 0;
          }
          else {
            pcVar2 = pcVar2 + (long)pcVar26;
            bVar28 = false;
            uVar13 = 0;
            uVar18 = 0;
            do {
              bVar3 = pcVar2[uVar18];
              bVar9 = bVar28;
              local_50 = __n;
              if (9 < (byte)(bVar3 - 0x30)) {
                JVar12 = JL_STATUS_SUCCESS;
                uVar14 = (ulong)(bVar3 - 9);
                if (bVar3 - 9 < 0x3d) {
                  if ((0x1000003400000000U >> (uVar14 & 0x3f) & 1) == 0) {
                    if (uVar14 == 2) {
                      if (_Var15 == false) goto LAB_00103819;
                    }
                    else if ((0x800013UL >> (uVar14 & 0x3f) & 1) == 0) goto LAB_00103802;
                    goto LAB_0010391d;
                  }
                }
                else {
LAB_00103802:
                  if (bVar3 != 0x65) {
                    if ((bVar3 == 0xc & _Var15) != 0) goto LAB_0010391d;
LAB_00103819:
                    if ((((bVar3 == 0x2c) || (bVar3 == 0x5d)) || (bVar3 == 0x7d)) ||
                       ((bVar3 == 0xc2 && (_Var15 ^ 1U) == 0 && (pcVar2[uVar18 + 1] == -0x60))))
                    goto LAB_0010391d;
                    uVar19 = (uint)bVar3;
                    if (_Var15 != false) {
                      if (((uVar19 == 0xe2) && (pcVar2[uVar18 + 1] == -0x80)) &&
                         (pcVar2[uVar18 + 2] == -0x58)) goto LAB_0010391d;
                      if ((uVar19 == 0xef) && (pcVar2[uVar18 + 1] == -0x45)) {
                        if (pcVar2[uVar18 + 2] == -0x41) goto LAB_0010391d;
                      }
                      else if (uVar19 == 0x2f) goto LAB_0010391d;
                    }
                    if ((((uVar18 != 1 || (_Var15 ^ 1U) != 0) || (*local_70 != '0')) ||
                        (bVar9 = true, (byte)(local_70[1] | 0x20U) != 0x78)) &&
                       (((JVar12 = JL_STATUS_INVALID_DATA, !bVar28 || (0x25 < uVar19 - 0x41)) ||
                        (bVar9 = bVar28, (0x3f0000003fU >> ((ulong)(uVar19 - 0x41) & 0x3f) & 1) == 0
                        )))) goto LAB_0010391d;
                  }
                }
              }
              bVar28 = bVar9;
              uVar14 = uVar18 + 1;
              uVar13 = uVar18;
              uVar18 = uVar14;
            } while (uVar25 != uVar14);
            JVar12 = JL_STATUS_SUCCESS;
            uVar13 = uVar25 - 1;
          }
LAB_0010391d:
          uVar25 = uVar8 & 0xff;
          JVar10 = JVar12;
          if (0x11 < uVar13) {
            JVar10 = JL_STATUS_INVALID_DATA;
          }
          if (uVar13 == 1) {
            JVar10 = JL_STATUS_INVALID_DATA;
          }
          if (!bVar28) {
            JVar10 = JVar12;
          }
          if ((JVar10 == JL_STATUS_SUCCESS && _Var15 == false) &&
             (JVar10 = JL_STATUS_SUCCESS, local_70[uVar13] == '.')) {
            JVar10 = JL_STATUS_INVALID_DATA;
          }
          cVar22 = _Var15;
          if (!bVar27 && JVar10 == JL_STATUS_SUCCESS) {
            __n = uVar13 + 1;
            if (__n != 0) {
              bVar17 = true;
              uVar14 = 0;
              bVar4 = false;
              bVar9 = false;
              bVar27 = false;
              uVar13 = uVar25;
              uVar18 = uVar25;
              do {
                cVar22 = (char)uVar18;
                if (bVar28) {
                  if ((1 < uVar14) && (9 < (byte)(local_70[uVar14] - 0x30U))) {
                    JVar10 = JL_STATUS_INVALID_DATA;
                    uVar19 = (byte)local_70[uVar14] - 0x41;
                    if ((0x25 < uVar19) ||
                       (uVar18 = CONCAT71(0x3f000000,_Var15), cVar22 = _Var15,
                       (0x3f0000003fU >> ((ulong)uVar19 & 0x3f) & 1) == 0)) goto LAB_00103aea;
                  }
                }
                else {
                  bVar3 = local_70[uVar14];
                  if (9 < (byte)(bVar3 - 0x30)) {
                    JVar10 = JL_STATUS_INVALID_DATA;
                    if (bVar3 < 0x2e) {
                      uVar6 = uVar13;
                      if (bVar3 == 0x2b) goto joined_r0x00103a80;
                      bVar5 = bVar17;
                      if (bVar3 != 0x2d) goto LAB_00103aea;
joined_r0x00103a4a:
                      if (!bVar5) goto LAB_00103aea;
                    }
                    else {
                      uVar6 = uVar25;
                      if (bVar3 == 0x2e) {
joined_r0x00103a80:
                        if ((uVar6 & 1) == 0) goto LAB_00103aea;
                      }
                      else if ((bVar3 != 0x45) || (!bVar27)) {
                        bVar5 = bVar27;
                        if (bVar3 == 0x65) goto joined_r0x00103a4a;
                        goto LAB_00103aea;
                      }
                    }
                  }
                  if ((bVar3 == 0x65) || (bVar3 == 0x45)) {
                    bVar17 = true;
                    uVar13 = 1;
                    bVar27 = false;
                    uVar25 = 0;
                    bVar4 = true;
                  }
                  else if (bVar3 == 0x2e) {
                    bVar9 = true;
                    bVar27 = false;
                    uVar25 = 0;
                  }
                  else {
                    if (!bVar4) {
                      bVar27 = true;
                    }
                    if (!bVar9 && !bVar4) {
                      uVar25 = 1;
                    }
                    bVar17 = false;
                    uVar13 = 0;
                  }
                }
                cVar22 = (char)uVar18;
                uVar14 = uVar14 + 1;
              } while (__n != uVar14);
            }
            JVar10 = JL_STATUS_SUCCESS;
          }
LAB_00103aea:
          if (JVar10 == JL_STATUS_SUCCESS) {
            if ((cVar22 == '\0') || (*local_70 != '+')) {
              lVar20 = 0;
            }
            else {
              local_70 = local_70 + 1;
              __n = __n - 1;
              lVar20 = 1;
            }
            pcVar23 = (char *)WjTestLib_Calloc(__n + 1,1);
            if (pcVar23 == (char *)0x0) {
              JVar10 = JL_STATUS_OUT_OF_MEMORY;
              pcVar23 = (char *)0x0;
              lVar20 = 0;
            }
            else {
              memcpy(pcVar23,local_70,__n);
              lVar20 = lVar20 + __n;
              JVar10 = JL_STATUS_SUCCESS;
            }
          }
          else {
            pcVar23 = (char *)0x0;
            lVar20 = 0;
          }
          if (JVar10 == JL_STATUS_SUCCESS) {
            local_a8.StringIndex = local_a8.StringIndex + lVar20;
            local_a8.Stack[local_a8.StackIndex].FinishedProcessing = true;
            JVar10 = JlSetObjectNumberString(local_a8.Stack[local_a8.StackIndex].Object,pcVar23);
LAB_00103bfc:
            WjTestLib_Free(pcVar23);
          }
          goto LAB_00103c07;
        case JL_DATA_TYPE_BOOL:
          if ((local_a8.JsonStringLength - local_a8.StringIndex < 4) ||
             (*(int *)(local_a8.JsonString + local_a8.StringIndex) != 0x65757274)) {
            if ((local_a8.JsonStringLength - local_a8.StringIndex < 5) ||
               ((local_a8.JsonString + 4)[local_a8.StringIndex] != 'e' ||
                *(int *)(local_a8.JsonString + local_a8.StringIndex) != 0x736c6166)) {
              JVar10 = JL_STATUS_INVALID_DATA;
              bVar27 = false;
              lVar20 = 0;
            }
            else {
              lVar20 = 5;
              JVar10 = JL_STATUS_SUCCESS;
              bVar27 = true;
            }
            _Var15 = false;
          }
          else {
            lVar20 = 4;
            JVar10 = JL_STATUS_SUCCESS;
            bVar27 = true;
            _Var15 = true;
          }
          if (bVar27) {
            local_a8.StringIndex = local_a8.StringIndex + lVar20;
            local_a8.Stack[uVar25].FinishedProcessing = true;
            JVar10 = JlSetObjectBool(local_a8.Stack[uVar25].Object,_Var15);
          }
LAB_00103c07:
          if (JVar10 != JL_STATUS_SUCCESS) {
            JlFreeObjectTree(&local_a8.Stack[local_a8.StackIndex].Object);
          }
          break;
        case JL_DATA_TYPE_LIST:
          _Var15 = local_a8.Stack[uVar25].ProcessedFirstItem;
          if (_Var15 == false) {
            local_a8.StringIndex = local_a8.StringIndex + 1;
          }
          JVar10 = SkipWhiteSpace(&local_a8,(char *)&local_b0);
          if (JVar10 == JL_STATUS_SUCCESS) {
            if (pPVar7[uVar25].PrevScanComma == false) {
              if ((byte)local_b0 == ',') {
                JVar10 = JL_STATUS_INVALID_DATA;
                if (_Var15 == false) goto LAB_00103cef;
                local_a8.StringIndex = local_a8.StringIndex + 1;
                pPVar7[uVar25].PrevScanComma = true;
              }
              else if ((byte)local_b0 == ']') {
LAB_00103b7d:
                pPVar7[uVar25].FinishedProcessing = true;
                local_a8.StringIndex = local_a8.StringIndex + 1;
              }
              else {
                JVar10 = JL_STATUS_INVALID_DATA;
                if (_Var15 != false) goto LAB_00103cef;
                pPVar7[uVar25].ScanForSubObjects = true;
              }
LAB_00103cec:
              JVar10 = JL_STATUS_SUCCESS;
            }
            else {
              JVar10 = JL_STATUS_INVALID_DATA;
              if ((byte)local_b0 != ',') {
                if ((byte)local_b0 != ']') {
                  pPVar7[uVar25].ScanForSubObjects = true;
                  pPVar7[uVar25].PrevScanComma = false;
                  goto LAB_00103cec;
                }
                if (local_a8.IsJson5 == true) goto LAB_00103b7d;
              }
            }
LAB_00103cef:
            pPVar7[uVar25].ProcessedFirstItem = true;
          }
          bVar27 = pErrorAtPos == (size_t *)0x0;
          bVar28 = JVar10 == JL_STATUS_SUCCESS;
LAB_00103cff:
          if ((!(bool)(bVar28 | bVar27)) && (*pErrorAtPos == 0)) {
            *pErrorAtPos = local_a8.StringIndex;
          }
          break;
        case JL_DATA_TYPE_DICTIONARY:
          _Var15 = local_a8.Stack[uVar25].ProcessedFirstItem;
          if (_Var15 == false) {
            local_a8.StringIndex = local_a8.StringIndex + 1;
            local_a8.Stack[uVar25].DictionaryScanState = DICT_SCAN_STATE_NEED_KEY;
          }
          JVar10 = SkipWhiteSpace(&local_a8,(char *)&local_b0);
          if (JVar10 == JL_STATUS_SUCCESS) {
            JVar10 = JL_STATUS_SUCCESS;
            switch(pPVar7[uVar25].DictionaryScanState) {
            case DICT_SCAN_STATE_NEED_KEY:
              if (((byte)local_b0 == 0x22) || ((byte)local_b0 == 0x27 && local_a8.IsJson5 == true))
              {
                _Var15 = false;
              }
              else {
                if ((local_a8.IsJson5 == false) ||
                   ((((byte)local_b0 != 0x24 && ((byte)local_b0 != 0x5f)) &&
                    (0x19 < (byte)(((byte)local_b0 & 0xdf) + 0xbf))))) {
                  JVar10 = JL_STATUS_INVALID_DATA;
                  if (((byte)local_b0 == 0x7d) && (_Var15 != true || local_a8.IsJson5 != false)) {
                    pPVar7[uVar25].FinishedProcessing = true;
                    pPVar7[uVar25].DictionaryScanState = DICT_SCAN_STATE_NONE;
                    goto LAB_00103c8e;
                  }
                  break;
                }
                _Var15 = true;
              }
              JVar10 = ParseKeyName(&local_a8,_Var15);
              pPVar7[uVar25].DictionaryScanState = DICT_SCAN_STATE_NEED_COLON;
              break;
            case DICT_SCAN_STATE_NEED_COLON:
              JVar10 = JL_STATUS_INVALID_DATA;
              if ((byte)local_b0 == 0x3a) {
                pPVar7[uVar25].DictionaryScanState = DICT_SCAN_STATE_NEED_VALUE;
                pPVar7[uVar25].ScanForSubObjects = true;
LAB_00103c8e:
                local_a8.StringIndex = local_a8.StringIndex + 1;
                goto LAB_00103c93;
              }
              break;
            case DICT_SCAN_STATE_NEED_VALUE:
              pPVar7[uVar25].DictionaryScanState = DICT_SCAN_STATE_NEED_COMMA_OR_END;
              pPVar7[uVar25].ScanForSubObjects = false;
LAB_00103c93:
              JVar10 = JL_STATUS_SUCCESS;
              break;
            case DICT_SCAN_STATE_NEED_COMMA_OR_END:
              if ((byte)local_b0 == 0x7d) {
                pPVar7[uVar25].FinishedProcessing = true;
                pPVar7[uVar25].DictionaryScanState = DICT_SCAN_STATE_NONE;
                local_a8.StringIndex = local_a8.StringIndex + 1;
              }
              else {
                JVar10 = JL_STATUS_INVALID_DATA;
                if ((byte)local_b0 == 0x2c) {
                  pPVar7[uVar25].DictionaryScanState = DICT_SCAN_STATE_NEED_KEY;
                  goto LAB_00103c8e;
                }
              }
            }
            if ((JVar10 != JL_STATUS_SUCCESS) && (pPVar7[uVar25].CurrentKeyName != (char *)0x0)) {
              WjTestLib_Free(pPVar7[uVar25].CurrentKeyName);
              pPVar7[uVar25].CurrentKeyName = (char *)0x0;
            }
            bVar27 = JVar10 == JL_STATUS_SUCCESS;
            bVar28 = pErrorAtPos == (size_t *)0x0;
            pPVar7[uVar25].ProcessedFirstItem = true;
            goto LAB_00103cff;
          }
          break;
        default:
          JVar10 = JL_STATUS_SUCCESS;
        }
LAB_001034ec:
        sVar16 = local_a8.StringIndex;
        uVar25 = local_a8._8_8_ & 0xffffffff;
      } while ((-1 < local_a8.StackIndex) && (pcVar23 = pcVar26, JVar10 == JL_STATUS_SUCCESS));
      if (JVar10 == JL_STATUS_SUCCESS) {
        pcVar23 = local_48 + local_a8.StringIndex;
        JsonStringLength = strlen(pcVar23);
        local_b0 = (char *)0x0;
        local_34 = JL_DATA_TYPE_NONE;
        local_68 = 0;
        JVar12 = DetectNewType(pcVar23,JsonStringLength,0,SUB41(local_5c,0),(size_t *)&local_b0,
                               &local_34,&local_68);
        JVar10 = JL_STATUS_SUCCESS;
        if (JVar12 == JL_STATUS_SUCCESS) {
          local_a8.StackIndex = 1;
          JVar10 = JL_STATUS_INVALID_DATA;
          if (pErrorAtPos != (size_t *)0x0) {
            *pErrorAtPos = sVar16;
          }
        }
      }
      if (JVar10 == JL_STATUS_SUCCESS) {
        *local_40 = local_a8.Stack[1].Object;
      }
      else {
        lVar20 = (long)local_a8.StackIndex;
        if (0 < lVar20) {
          lVar21 = lVar20 + 1;
          ppcVar24 = &local_a8.Stack[lVar20].CurrentKeyName;
          do {
            JlFreeObjectTree((JlDataObject **)(ppcVar24 + -2));
            if (*ppcVar24 != (char *)0x0) {
              WjTestLib_Free(*ppcVar24);
              *ppcVar24 = (char *)0x0;
            }
            lVar21 = lVar21 + -1;
            ppcVar24 = ppcVar24 + -5;
          } while (1 < lVar21);
        }
      }
      WjTestLib_Free(local_a8.Stack);
    }
    if (((pErrorAtPos != (size_t *)0x0) && (JVar10 != JL_STATUS_SUCCESS)) && (*pErrorAtPos == 0)) {
      *pErrorAtPos = (size_t)pcVar26;
    }
  }
  return JVar10;
}

Assistant:

JL_STATUS
    JlParseJsonEx
    (
        char const*     JsonString,
        bool            IsJson5,
        JlDataObject**  pRootObject,
        size_t*         pErrorAtPos
    )
{
    JL_STATUS jlStatus;

    if(     NULL != JsonString
        &&  NULL != pRootObject )
    {
        size_t prevStringIndex = 0;
        ParseParameters params = { 0 };
        params.JsonString = JsonString;
        params.JsonStringLength = strlen( JsonString );
        params.StringIndex = 0;
        params.IsJson5 = IsJson5;
        // Stack is allocated 2 more because we don't use the first element and we need an extra one to contain the last list
        // or dictionary nest levels items.
        params.Stack = JlAlloc( sizeof(ParseStack) * (MAX_JSON_DEPTH+2) );

        if( NULL != pErrorAtPos )
        {
            *pErrorAtPos = 0;
        }

        if( NULL != params.Stack )
        {
            // Setup first item in stack as the "none" type (for whitespace). When this is popped off we
            // will have finished.
            params.StackIndex = 0;
            params.Stack[0].Type = JL_DATA_TYPE_NONE;
            params.Stack[0].ScanForSubObjects = true;

            jlStatus = JL_STATUS_SUCCESS;
            while( params.StackIndex >= 0  &&  JL_STATUS_SUCCESS == jlStatus )
            {
                ParseStack* stackItem = &params.Stack[params.StackIndex];

                if( ! stackItem->FinishedProcessing )
                {
                    prevStringIndex = params.StringIndex;
                    if( params.Stack[params.StackIndex].ScanForSubObjects )
                    {
                        if( JL_DATA_TYPE_NONE == params.Stack[params.StackIndex].Type )
                        {
                            // Note we must mark it finished first because ParseForNewType will adjust StackIndex
                            stackItem->FinishedProcessing = true;
                            stackItem->ScanForSubObjects = false;
                        }
                        // Turn off scanning for sub objects as we will need to go back to list or dictionary
                        // processing between objects
                        stackItem->ScanForSubObjects = false;

                        jlStatus = ParseForNewType( &params, IsJson5, pErrorAtPos );
                    }
                    else if( JL_DATA_TYPE_STRING == stackItem->Type )
                    {
                        jlStatus = ParseForString( &params, pErrorAtPos );
                    }
                    else if( JL_DATA_TYPE_NUMBER == stackItem->Type )
                    {
                        jlStatus = ParseForNumber( &params );
                    }
                    else if( JL_DATA_TYPE_BOOL == stackItem->Type )
                    {
                        jlStatus = ParseForBool( &params );
                    }
                    else if( JL_DATA_TYPE_LIST == stackItem->Type )
                    {
                        jlStatus = ParseForList( &params, pErrorAtPos );
                    }
                    else if( JL_DATA_TYPE_DICTIONARY == stackItem->Type )
                    {
                        jlStatus = ParseForDictionary( &params, pErrorAtPos );
                    }

                }
                else
                {
                    // Attempt to attach this object to previous level (if its a list or dictionary)
                    jlStatus = AttachStackObjectToPreviousObject( params.Stack, params.StackIndex, pErrorAtPos );
                    // Finished with this level. So pop off the stack
                    params.StackIndex -= 1;
                }
            }

            if( JL_STATUS_SUCCESS == jlStatus )
            {
                // Verify that there is nothing but white space after the final object.
                jlStatus = VerifyOnlyTrailingWhiteSpace( JsonString + params.StringIndex, IsJson5 );
                if( JL_STATUS_SUCCESS != jlStatus )
                {
                    // At this point we have a full object tree created, but the params are now
                    // reset. So modify index so it will remove the full tree (at index 1)
                    params.StackIndex = 1;

                    if( NULL != pErrorAtPos )
                    {
                        *pErrorAtPos = params.StringIndex;
                    }
                }
            }

            if( JL_STATUS_SUCCESS == jlStatus )
            {
                // Get root object (in index position 1)
                *pRootObject = params.Stack[1].Object;
            }
            else
            {
                // Free object tree created so far
                for( int32_t i=params.StackIndex; i>0; i-- )
                {
                    (void) JlFreeObjectTree( &params.Stack[i].Object );
                    if( NULL != params.Stack[i].CurrentKeyName )
                    {
                        JlFree( params.Stack[i].CurrentKeyName );
                        params.Stack[i].CurrentKeyName = NULL;
                    }
                }
            }

            JlFree( params.Stack );
        }
        else
        {
            jlStatus = JL_STATUS_OUT_OF_MEMORY;
        }

        if( JL_STATUS_SUCCESS != jlStatus )
        {
            // If optional parameter was provided, then set the position of the error in the string.
            if(     NULL != pErrorAtPos
                &&  0 == *pErrorAtPos )
            {
                *pErrorAtPos = prevStringIndex;
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}